

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [23],uint *Args_4,char (*Args_5) [41],uint *Args_6,
          char (*Args_7) [13],uint *Args_8,char (*Args_9) [47],uint *Args_10,char (*Args_11) [3])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [29])this,(char **)Args,(char (*) [15])Args_1,(char (*) [23])Args_2,
             (uint *)Args_3,(char (*) [41])Args_4,(uint *)Args_5,(char (*) [13])Args_6,
             (uint *)Args_7,(char (*) [47])Args_8,(uint *)Args_9,(char (*) [3])Args_10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}